

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O0

int32_t MBCS_FROM_UCHAR32_ISO2022
                  (UConverterSharedData *sharedData,UChar32 c,uint32_t *value,UBool useFallback,
                  int outputType)

{
  uint uVar1;
  uint16_t *puVar2;
  int32_t *cx_00;
  byte *pbVar3;
  uint8_t *p;
  uint local_48;
  int32_t length;
  uint32_t myValue;
  uint32_t stage2Entry;
  uint16_t *table;
  int32_t *cx;
  int outputType_local;
  UBool useFallback_local;
  uint32_t *value_local;
  UChar32 c_local;
  UConverterSharedData *sharedData_local;
  
  if ((c < 0x10000) || (((sharedData->mbcs).unicodeMask & 1) != 0)) {
    puVar2 = (sharedData->mbcs).fromUnicodeTable;
    uVar1 = *(uint *)(puVar2 + (long)(int)((uint)puVar2[c >> 10] + (c >> 4 & 0x3fU)) * 2);
    if (outputType == 1) {
      local_48 = (uint)*(ushort *)
                        ((sharedData->mbcs).fromUnicodeBytes +
                        (ulong)((uVar1 & 0xffff) * 0x10 + (c & 0xfU)) * 2);
      if (local_48 < 0x100) {
        p._4_4_ = 1;
      }
      else {
        p._4_4_ = 2;
      }
    }
    else {
      pbVar3 = (sharedData->mbcs).fromUnicodeBytes + ((uVar1 & 0xffff) * 0x10 + (c & 0xfU)) * 3;
      local_48 = (uint)*pbVar3 << 0x10 | (uint)pbVar3[1] << 8 | (uint)pbVar3[2];
      if (local_48 < 0x100) {
        p._4_4_ = 1;
      }
      else if (local_48 < 0x10000) {
        p._4_4_ = 2;
      }
      else {
        p._4_4_ = 3;
      }
    }
    if ((uVar1 & 1 << (((byte)c & 0xf) + 0x10 & 0x1f)) != 0) {
      *value = local_48;
      return p._4_4_;
    }
    if ((((useFallback != '\0') || (c - 0xe000U < 0x1900)) || (c - 0xf0000U < 0x20000)) &&
       (local_48 != 0)) {
      *value = local_48;
      return -p._4_4_;
    }
  }
  cx_00 = (sharedData->mbcs).extIndexes;
  if (cx_00 == (int32_t *)0x0) {
    sharedData_local._4_4_ = 0;
  }
  else {
    sharedData_local._4_4_ = ucnv_extSimpleMatchFromU_63(cx_00,c,value,useFallback);
  }
  return sharedData_local._4_4_;
}

Assistant:

static inline int32_t
MBCS_FROM_UCHAR32_ISO2022(UConverterSharedData* sharedData,
                                         UChar32 c,
                                         uint32_t* value,
                                         UBool useFallback,
                                         int outputType)
{
    const int32_t *cx;
    const uint16_t *table;
    uint32_t stage2Entry;
    uint32_t myValue;
    int32_t length;
    const uint8_t *p;
    /*
     * TODO(markus): Use and require new, faster MBCS conversion table structures.
     * Use internal version of ucnv_open() that verifies that the new structures are available,
     * else U_INTERNAL_PROGRAM_ERROR.
     */
    /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
    if(c<0x10000 || (sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY)) {
        table=sharedData->mbcs.fromUnicodeTable;
        stage2Entry=MBCS_STAGE_2_FROM_U(table, c);
        /* get the bytes and the length for the output */
        if(outputType==MBCS_OUTPUT_2){
            myValue=MBCS_VALUE_2_FROM_STAGE_2(sharedData->mbcs.fromUnicodeBytes, stage2Entry, c);
            if(myValue<=0xff) {
                length=1;
            } else {
                length=2;
            }
        } else /* outputType==MBCS_OUTPUT_3 */ {
            p=MBCS_POINTER_3_FROM_STAGE_2(sharedData->mbcs.fromUnicodeBytes, stage2Entry, c);
            myValue=((uint32_t)*p<<16)|((uint32_t)p[1]<<8)|p[2];
            if(myValue<=0xff) {
                length=1;
            } else if(myValue<=0xffff) {
                length=2;
            } else {
                length=3;
            }
        }
        /* is this code point assigned, or do we use fallbacks? */
        if((stage2Entry&(1<<(16+(c&0xf))))!=0) {
            /* assigned */
            *value=myValue;
            return length;
        } else if(FROM_U_USE_FALLBACK(useFallback, c) && myValue!=0) {
            /*
             * We allow a 0 byte output if the "assigned" bit is set for this entry.
             * There is no way with this data structure for fallback output
             * to be a zero byte.
             */
            *value=myValue;
            return -length;
        }
    }

    cx=sharedData->mbcs.extIndexes;
    if(cx!=NULL) {
        return ucnv_extSimpleMatchFromU(cx, c, value, useFallback);
    }

    /* unassigned */
    return 0;
}